

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  ulong uVar1;
  Value *pVVar2;
  Value *pVVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__DictionaryValue_KeyValuePair_004b23f8;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  pVVar2 = from->key_;
  if (pVVar2 == (Value *)0x0 ||
      from == (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    pVVar3 = (Value *)0x0;
  }
  else {
    pVVar3 = (Value *)operator_new(0x30);
    Value::Value(pVVar3,pVVar2);
  }
  this->key_ = pVVar3;
  pVVar2 = from->value_;
  if (pVVar2 == (Value *)0x0 ||
      from == (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    pVVar3 = (Value *)0x0;
  }
  else {
    pVVar3 = (Value *)operator_new(0x30);
    Value::Value(pVVar3,pVVar2);
  }
  this->value_ = pVVar3;
  return;
}

Assistant:

DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair(const DictionaryValue_KeyValuePair& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_key()) {
    key_ = new ::CoreML::Specification::MILSpec::Value(*from.key_);
  } else {
    key_ = nullptr;
  }
  if (from._internal_has_value()) {
    value_ = new ::CoreML::Specification::MILSpec::Value(*from.value_);
  } else {
    value_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
}